

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compile.cc
# Opt level: O0

void __thiscall re2::Compiler::Add_80_10ffff(Compiler *this)

{
  int iVar1;
  undefined8 in_RDI;
  int next;
  ByteRangeProg *p;
  size_t i;
  int inst [12];
  undefined4 in_stack_ffffffffffffffb0;
  undefined4 uVar2;
  ulong local_40;
  int in_stack_ffffffffffffffc8;
  undefined1 in_stack_ffffffffffffffcd;
  uint8_t in_stack_ffffffffffffffce;
  uint8_t in_stack_ffffffffffffffcf;
  Compiler *in_stack_ffffffffffffffd0;
  
  memset(&stack0xffffffffffffffc8,0,0x30);
  for (local_40 = 0; local_40 < 0xc; local_40 = local_40 + 1) {
    uVar2 = 0;
    if (-1 < *(int *)(prog_80_10ffff + local_40 * 0xc)) {
      uVar2 = *(undefined4 *)
               (&stack0xffffffffffffffc8 + (long)*(int *)(prog_80_10ffff + local_40 * 0xc) * 4);
    }
    iVar1 = UncachedRuneByteSuffix
                      (in_stack_ffffffffffffffd0,in_stack_ffffffffffffffcf,in_stack_ffffffffffffffce
                       ,(bool)in_stack_ffffffffffffffcd,in_stack_ffffffffffffffc8);
    *(int *)(&stack0xffffffffffffffc8 + local_40 * 4) = iVar1;
    if ((*(uint *)(prog_80_10ffff + local_40 * 0xc + 4) & 0xc0) != 0x80) {
      AddSuffix((Compiler *)CONCAT44(uVar2,in_stack_ffffffffffffffb0),(int)((ulong)in_RDI >> 0x20));
    }
  }
  return;
}

Assistant:

void Compiler::Add_80_10ffff() {
  int inst[arraysize(prog_80_10ffff)] = { 0 }; // does not need to be initialized; silences gcc warning
  for (size_t i = 0; i < arraysize(prog_80_10ffff); i++) {
    const ByteRangeProg& p = prog_80_10ffff[i];
    int next = 0;
    if (p.next >= 0)
      next = inst[p.next];
    inst[i] = UncachedRuneByteSuffix(static_cast<uint8_t>(p.lo),
                                     static_cast<uint8_t>(p.hi), false, next);
    if ((p.lo & 0xC0) != 0x80)
      AddSuffix(inst[i]);
  }
}